

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableRequiresCommand.cxx
# Opt level: O0

bool __thiscall
cmVariableRequiresCommand::InitialPass
          (cmVariableRequiresCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  cmState *pcVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  ulong uVar6;
  char *pcVar7;
  bool local_22a;
  bool local_229;
  bool local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  allocator local_161;
  string local_160 [8];
  string message;
  string local_138;
  char *local_118;
  char *reqVar;
  string local_108;
  uint local_e4;
  cmState *pcStack_e0;
  uint i;
  cmState *state;
  string local_d0 [7];
  bool hasAdvanced;
  string notSet;
  undefined1 local_a8 [7];
  bool requirementsMet;
  string resultVariable;
  undefined1 local_80 [8];
  string testVariable;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmVariableRequiresCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar3 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0035,
                     "The variable_requires command should not be called; see CMP0035.");
  if (bVar3) {
    this_local._7_1_ = 1;
  }
  else {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (sVar4 < 3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_48,"called with incorrect number of arguments",&local_49);
      cmCommand::SetError(&this->super_cmCommand,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      this_local._7_1_ = 0;
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      std::__cxx11::string::string((string *)local_80,(string *)pvVar5);
      bVar3 = cmMakefile::IsOn((this->super_cmCommand).Makefile,(string *)local_80);
      if (bVar3) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,1);
        std::__cxx11::string::string((string *)local_a8,(string *)pvVar5);
        notSet.field_2._M_local_buf[0xf] = '\x01';
        std::__cxx11::string::string(local_d0);
        state._7_1_ = 0;
        pcStack_e0 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        for (local_e4 = 2; uVar6 = (ulong)local_e4,
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local), uVar6 < sVar4; local_e4 = local_e4 + 1) {
          pcVar1 = (this->super_cmCommand).Makefile;
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,(ulong)local_e4);
          bVar3 = cmMakefile::IsOn(pcVar1,pvVar5);
          if (!bVar3) {
            notSet.field_2._M_local_buf[0xf] = '\0';
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)local_e4);
            std::__cxx11::string::operator+=(local_d0,(string *)pvVar5);
            std::__cxx11::string::operator+=(local_d0,"\n");
            pcVar2 = pcStack_e0;
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)local_e4);
            reqVar._6_1_ = 0;
            reqVar._5_1_ = 0;
            pcVar7 = cmState::GetCacheEntryValue(pcVar2,pvVar5);
            pcVar2 = pcStack_e0;
            local_1f9 = false;
            if (pcVar7 != (char *)0x0) {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_2_local,(ulong)local_e4);
              std::allocator<char>::allocator();
              reqVar._6_1_ = 1;
              std::__cxx11::string::string
                        ((string *)&local_108,"ADVANCED",(allocator *)((long)&reqVar + 7));
              reqVar._5_1_ = 1;
              local_1f9 = cmState::GetCacheEntryPropertyAsBool(pcVar2,pvVar5,&local_108);
            }
            if ((reqVar._5_1_ & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_108);
            }
            if ((reqVar._6_1_ & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)((long)&reqVar + 7));
            }
            if (local_1f9 != false) {
              state._7_1_ = 1;
            }
          }
        }
        pcVar7 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,(string *)local_a8);
        message.field_2._M_local_buf[0xe] = '\0';
        message.field_2._M_local_buf[0xd] = '\0';
        local_229 = true;
        local_118 = pcVar7;
        if (pcVar7 != (char *)0x0) {
          local_22a = false;
          if ((notSet.field_2._M_local_buf[0xf] & 1U) == 0) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            message.field_2._M_local_buf[0xe] = '\x01';
            std::__cxx11::string::string
                      ((string *)&local_138,pcVar7,(allocator *)(message.field_2._M_local_buf + 0xf)
                      );
            message.field_2._M_local_buf[0xd] = '\x01';
            local_22a = cmMakefile::IsOn(pcVar1,&local_138);
          }
          local_229 = local_22a;
        }
        if ((message.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_138);
        }
        if ((message.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
        }
        if (local_229 != false) {
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,(string *)local_a8,
                     (bool)(notSet.field_2._M_local_buf[0xf] & 1));
        }
        if ((notSet.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_160,"Variable assertion failed:\n",&local_161);
          std::allocator<char>::~allocator((allocator<char> *)&local_161);
          std::operator+(&local_188,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80," Requires that the following unset variables are set:\n");
          std::__cxx11::string::operator+=(local_160,(string *)&local_188);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::operator+=(local_160,local_d0);
          std::__cxx11::string::operator+=(local_160,"\nPlease set them, or set ");
          std::operator+(&local_1a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80," to false, and re-configure.\n");
          std::__cxx11::string::operator+=(local_160,(string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          if ((state._7_1_ & 1) != 0) {
            std::__cxx11::string::operator+=
                      (local_160,
                       "One or more of the required variables is advanced.  To set the variable, you must turn on advanced mode in cmake."
                      );
          }
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error(pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
          std::__cxx11::string::~string(local_160);
        }
        this_local._7_1_ = 1;
        resultVariable.field_2._12_4_ = 1;
        std::__cxx11::string::~string(local_d0);
        std::__cxx11::string::~string((string *)local_a8);
      }
      else {
        this_local._7_1_ = 1;
        resultVariable.field_2._12_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_80);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmVariableRequiresCommand
::InitialPass(std::vector<std::string>const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0035,
      "The variable_requires command should not be called; see CMP0035."))
    { return true; }
  if(args.size() < 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string testVariable = args[0];
  if(!this->Makefile->IsOn(testVariable))
    {
    return true;
    }
  std::string resultVariable = args[1];
  bool requirementsMet = true;
  std::string notSet;
  bool hasAdvanced = false;
  cmState* state = this->Makefile->GetState();
  for(unsigned int i = 2; i < args.size(); ++i)
    {
    if(!this->Makefile->IsOn(args[i]))
      {
      requirementsMet = false;
      notSet += args[i];
      notSet += "\n";
      if(state->GetCacheEntryValue(args[i]) &&
          state->GetCacheEntryPropertyAsBool(args[i], "ADVANCED"))
        {
        hasAdvanced = true;
        }
      }
    }
  const char* reqVar = this->Makefile->GetDefinition(resultVariable);
  // if reqVar is unset, then set it to requirementsMet
  // if reqVar is set to true, but requirementsMet is false , then
  // set reqVar to false.
  if(!reqVar || (!requirementsMet && this->Makefile->IsOn(reqVar)))
    {
    this->Makefile->AddDefinition(resultVariable, requirementsMet);
    }

  if(!requirementsMet)
    {
    std::string message = "Variable assertion failed:\n";
    message += testVariable +
      " Requires that the following unset variables are set:\n";
    message += notSet;
    message += "\nPlease set them, or set ";
    message += testVariable + " to false, and re-configure.\n";
    if(hasAdvanced)
      {
      message +=
        "One or more of the required variables is advanced."
        "  To set the variable, you must turn on advanced mode in cmake.";
      }
    cmSystemTools::Error(message.c_str());
    }

  return true;
}